

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileInstaller.cxx
# Opt level: O1

void __thiscall
cmFileInstaller::ReportCopy(cmFileInstaller *this,string *toFile,Type type,bool copy)

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string message;
  string local_70;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_50;
  size_type local_38;
  pointer local_30;
  undefined8 local_28;
  
  if (this->MessageNever == false) {
    if (copy) {
      local_50.first._M_str = "Installing: ";
    }
    else {
      if (this->MessageLazy != false) goto LAB_003d30b5;
      local_50.first._M_str = "Up-to-date: ";
    }
    local_50.first._M_len = 0xc;
    local_50.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_30 = (toFile->_M_dataplus)._M_p;
    local_38 = toFile->_M_string_length;
    local_28 = 0;
    views._M_len = 2;
    views._M_array = &local_50;
    cmCatViews(&local_70,views);
    cmMakefile::DisplayStatus((this->super_cmFileCopier).Makefile,&local_70,-1.0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
LAB_003d30b5:
  if (type != TypeDir) {
    ManifestAppend(this,toFile);
  }
  return;
}

Assistant:

void cmFileInstaller::ReportCopy(const std::string& toFile, Type type,
                                 bool copy)
{
  if (!this->MessageNever && (copy || !this->MessageLazy)) {
    std::string message =
      cmStrCat((copy ? "Installing: " : "Up-to-date: "), toFile);
    this->Makefile->DisplayStatus(message, -1);
  }
  if (type != TypeDir) {
    // Add the file to the manifest.
    this->ManifestAppend(toFile);
  }
}